

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O3

ValuedAction __thiscall despot::POMCP::Search(POMCP *this,double timeout)

{
  Belief *pBVar1;
  State *pSVar2;
  DSPOMDP *pDVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  clock_t cVar8;
  VNode *pVVar9;
  log_ostream *plVar10;
  long *plVar11;
  ostream *poVar12;
  QNode *pQVar13;
  ulong uVar14;
  ulong uVar15;
  size_type __new_size;
  double dVar16;
  ValuedAction VVar17;
  timeval tv;
  ValuedAction astar;
  timeval local_98;
  long local_88;
  double local_80;
  double local_78;
  ValuedAction local_70;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  History *local_38;
  
  local_48 = timeout;
  cVar8 = clock();
  uVar14 = 0;
  gettimeofday(&local_98,(__timezone_ptr_t)0x0);
  dVar16 = (double)local_98.tv_sec;
  local_80 = (double)local_98.tv_usec / 1000000.0;
  if (this->root_ == (VNode *)0x0) {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])(&local_98,pBVar1,1);
    pSVar2 = *(State **)local_98.tv_sec;
    operator_delete((void *)local_98.tv_sec,local_88 - local_98.tv_sec);
    pVVar9 = CreateVNode(0,pSVar2,this->prior_,(this->super_Solver).model_);
    this->root_ = pVVar9;
    pDVar3 = (this->super_Solver).model_;
    (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,pSVar2);
  }
  local_78 = (double)cVar8;
  local_80 = local_80 + dVar16;
  local_38 = &(this->super_Solver).history_;
  __new_size = (size_type)
               (int)((ulong)((long)(this->super_Solver).history_.actions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->super_Solver).history_.actions_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
  local_40 = &(this->super_Solver).history_.observations_;
  do {
    pBVar1 = (this->super_Solver).belief_;
    (*pBVar1->_vptr_Belief[2])(&local_98,pBVar1,1000);
    if (local_98.tv_usec == local_98.tv_sec) {
      bVar4 = false;
    }
    else {
      local_58 = (ulong)((int)uVar14 + 1);
      uVar15 = 0;
      local_60 = uVar14;
      local_50 = uVar14;
      do {
        pSVar2 = *(State **)(local_98.tv_sec + uVar15 * 8);
        iVar5 = logging::level();
        iVar7 = (int)uVar15;
        if (0 < iVar5) {
          iVar5 = logging::level();
          if (3 < iVar5) {
            plVar10 = logging::stream(4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&plVar10->super_ostream,"[POMCP::Search] Starting simulation ",0x24);
            plVar11 = (long *)std::ostream::operator<<(plVar10,(int)local_50 + iVar7);
            std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
            std::ostream::put((char)plVar11);
            std::ostream::flush();
          }
        }
        Simulate(pSVar2,this->root_,(this->super_Solver).model_,this->prior_);
        iVar5 = logging::level();
        if (0 < iVar5) {
          iVar5 = logging::level();
          if (3 < iVar5) {
            plVar10 = logging::stream(4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&plVar10->super_ostream,"[POMCP::Search] ",0x10);
            poVar12 = (ostream *)std::ostream::operator<<(plVar10,(int)local_58 + iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," simulations done",0x11);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
          }
        }
        std::vector<int,_std::allocator<int>_>::resize(&local_38->actions_,__new_size);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_40,__new_size);
        cVar8 = clock();
        bVar4 = local_48 <= ((double)cVar8 - local_78) / 1000000.0;
      } while ((!bVar4) &&
              (uVar15 = uVar15 + 1, uVar15 < (ulong)(local_98.tv_usec - local_98.tv_sec >> 3)));
      uVar14 = (ulong)((int)local_60 + iVar7 + 1);
    }
    if (local_98.tv_usec != local_98.tv_sec) {
      uVar15 = 0;
      do {
        pDVar3 = (this->super_Solver).model_;
        (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,*(undefined8 *)(local_98.tv_sec + uVar15 * 8));
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)(local_98.tv_usec - local_98.tv_sec >> 3));
    }
    if ((undefined8 *)local_98.tv_sec != (undefined8 *)0x0) {
      operator_delete((void *)local_98.tv_sec,local_88 - local_98.tv_sec);
    }
  } while (!bVar4);
  VVar17 = OptimalAction(this->root_);
  local_70.value = VVar17.value;
  uVar6 = VVar17.action;
  local_70.action = uVar6;
  iVar5 = logging::level();
  if (0 < iVar5) {
    iVar5 = logging::level();
    if (2 < iVar5) {
      plVar10 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar10->super_ostream,"[POMCP::Search] Search statistics",0x21);
      std::ios::widen((char)(plVar10->super_ostream)._vptr_basic_ostream[-3] + (char)plVar10);
      std::ostream::put((char)plVar10);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"OptimalAction = ",0x10);
      poVar12 = despot::operator<<(poVar12,&local_70);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"# Simulations = ",0x10);
      iVar5 = VNode::count(this->root_);
      plVar11 = (long *)std::ostream::operator<<(poVar12,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Time: CPU / Real = ",0x13);
      cVar8 = clock();
      poVar12 = std::ostream::_M_insert<double>(((double)cVar8 - local_78) / 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," / ",3);
      gettimeofday(&local_98,(__timezone_ptr_t)0x0);
      poVar12 = std::ostream::_M_insert<double>
                          (((double)local_98.tv_usec / 1000000.0 + (double)local_98.tv_sec) -
                           local_80);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"# active particles = ",0x15);
      iVar5 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[0x18])();
      plVar11 = (long *)std::ostream::operator<<(poVar12,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Tree size = ",0xc);
      iVar5 = VNode::Size(this->root_);
      plVar11 = (long *)std::ostream::operator<<(poVar12,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      std::ostream::flush();
      uVar6 = local_70.action;
    }
  }
  if (uVar6 == 0xffffffff) {
    iVar5 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])();
    if (0 < iVar5) {
      iVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"action ",7);
        poVar12 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
        pQVar13 = VNode::Child(this->root_,iVar5);
        iVar7 = QNode::count(pQVar13);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        pQVar13 = VNode::Child(this->root_,iVar5);
        dVar16 = QNode::value(pQVar13);
        poVar12 = std::ostream::_M_insert<double>(dVar16);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        iVar5 = iVar5 + 1;
        iVar7 = (*((this->super_Solver).model_)->_vptr_DSPOMDP[5])();
      } while (iVar5 < iVar7);
    }
  }
  VVar17._4_4_ = 0;
  VVar17.action = local_70.action;
  VVar17.value = local_70.value;
  return VVar17;
}

Assistant:

ValuedAction POMCP::Search(double timeout) {
	double start_cpu = clock(), start_real = get_time_second();

	if (root_ == NULL) {
		State* state = belief_->Sample(1)[0];
		root_ = CreateVNode(0, state, prior_, model_);
		model_->Free(state);
	}

	int hist_size = history_.Size();
	bool done = false;
	int num_sims = 0;
	while (true) {
		vector<State*> particles = belief_->Sample(1000);
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			logd << "[POMCP::Search] Starting simulation " << num_sims << endl;

			Simulate(particle, root_, model_, prior_);
 
			num_sims++;
			logd << "[POMCP::Search] " << num_sims << " simulations done" << endl;
			history_.Truncate(hist_size);

			if ((clock() - start_cpu) / CLOCKS_PER_SEC >= timeout) {
				done = true;
				break;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			model_->Free(particles[i]);
		}

		if (done)
			break;
	}

	ValuedAction astar = OptimalAction(root_);

	logi << "[POMCP::Search] Search statistics" << endl
		<< "OptimalAction = " << astar << endl 
		<< "# Simulations = " << root_->count() << endl
		<< "Time: CPU / Real = " << ((clock() - start_cpu) / CLOCKS_PER_SEC) << " / " << (get_time_second() - start_real) << endl
		<< "# active particles = " << model_->NumActiveParticles() << endl
		<< "Tree size = " << root_->Size() << endl;

	if (astar.action == -1) {
		for (ACT_TYPE action = 0; action < model_->NumActions(); action++) {
			cout << "action " << action << ": " << root_->Child(action)->count()
				<< " " << root_->Child(action)->value() << endl;
		}
	}

	// delete root_;
	return astar;
}